

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O1

void MpiDestroyReader(CP_Services Svcs,DP_RS_Stream RS_Stream_v)

{
  int iVar1;
  long lVar2;
  
  (*Svcs->verbose)(*RS_Stream_v,5,"MpiDestroyReader invoked [rank:%d]\n",
                   (ulong)*(uint *)((long)RS_Stream_v + 8));
  iVar1 = *(int *)((long)RS_Stream_v + 0x18);
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      if (*(undefined **)(*(long *)((long)RS_Stream_v + 0x88) + lVar2) != &ompi_mpi_comm_null) {
        MPI_Comm_disconnect(*(long *)((long)RS_Stream_v + 0x88) + lVar2);
      }
      lVar2 = lVar2 + 8;
    } while ((long)iVar1 * 8 != lVar2);
  }
  free(*(void **)((long)RS_Stream_v + 0x88));
  free(*(void **)((long)RS_Stream_v + 0x80));
  free(RS_Stream_v);
  return;
}

Assistant:

static void MpiDestroyReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v)
{
    MpiStreamRD StreamRS = (MpiStreamRD)RS_Stream_v;

    Svcs->verbose(StreamRS->Stream.CP_Stream, DPTraceVerbose,
                  "MpiDestroyReader invoked [rank:%d]\n", StreamRS->Stream.Rank);

    const int CohortSize = StreamRS->Link.CohortSize;

    for (int i = 0; i < CohortSize; i++)
    {
        if (StreamRS->CohortMpiComms[i] != MPI_COMM_NULL)
        {
            MPI_Comm_disconnect(&StreamRS->CohortMpiComms[i]);
        }
    }
    free(StreamRS->CohortMpiComms);
    free(StreamRS->CohortWriterInfo);
    free(StreamRS);
}